

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int evp_keyex_on_exchange
              (ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  ptls_key_exchange_context_t *__ptr;
  uint8_t *ptr;
  int iVar1;
  uint uVar2;
  EVP_PKEY *to;
  EVP_PKEY_CTX *ctx;
  uchar *key;
  EVP_PKEY_CTX *ctx_00;
  uint uVar3;
  
  __ptr = *_ctx;
  if (secret == (ptls_iovec_t *)0x0) {
    to = (EVP_PKEY *)0x0;
    uVar2 = 1;
    ctx_00 = (EVP_PKEY_CTX *)0x0;
    uVar3 = 0;
  }
  else {
    secret->base = (uint8_t *)0x0;
    if ((__ptr->pubkey).len == peerkey.len) {
      to = EVP_PKEY_new();
      uVar3 = 0x201;
      if (to != (EVP_PKEY *)0x0) {
        iVar1 = EVP_PKEY_copy_parameters(to,(EVP_PKEY *)__ptr[1].algo);
        if ((iVar1 < 1) ||
           (iVar1 = EVP_PKEY_set1_encoded_public_key(to,peerkey.base,peerkey.len), iVar1 < 1)) {
          ctx_00 = (EVP_PKEY_CTX *)0x0;
        }
        else {
          ctx = EVP_PKEY_CTX_new((EVP_PKEY *)__ptr[1].algo,(ENGINE *)0x0);
          ctx_00 = (EVP_PKEY_CTX *)0x0;
          if (((ctx != (EVP_PKEY_CTX *)0x0) &&
              (iVar1 = EVP_PKEY_derive_init(ctx), ctx_00 = ctx, 0 < iVar1)) &&
             (iVar1 = EVP_PKEY_derive_set_peer(ctx,to), 0 < iVar1)) {
            iVar1 = EVP_PKEY_derive(ctx,(uchar *)0x0,&secret->len);
            if (0 < iVar1) {
              key = (uchar *)malloc(secret->len);
              secret->base = key;
              uVar2 = 0;
              if (key != (uchar *)0x0) {
                iVar1 = EVP_PKEY_derive(ctx,key,&secret->len);
                uVar3 = 0x203;
                if (0 < iVar1) {
                  uVar3 = uVar2;
                }
                uVar2 = (uint)(0 < iVar1);
              }
              goto LAB_00107ae5;
            }
          }
        }
        uVar2 = 0;
        uVar3 = 0x203;
        goto LAB_00107ae5;
      }
    }
    else {
      uVar3 = 0x33;
    }
    to = (EVP_PKEY *)0x0;
    ctx_00 = (EVP_PKEY_CTX *)0x0;
    uVar2 = 0;
  }
LAB_00107ae5:
  if (ctx_00 != (EVP_PKEY_CTX *)0x0) {
    EVP_PKEY_CTX_free(ctx_00);
  }
  if (to != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(to);
  }
  if ((char)uVar2 == '\0') {
    free(secret->base);
  }
  if (release != 0) {
    if ((EVP_PKEY *)__ptr[1].algo != (EVP_PKEY *)0x0) {
      EVP_PKEY_free((EVP_PKEY *)__ptr[1].algo);
    }
    ptr = (__ptr->pubkey).base;
    if (ptr != (uint8_t *)0x0) {
      CRYPTO_free(ptr);
    }
    free(__ptr);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return uVar3;
}

Assistant:

static int evp_keyex_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_evp_keyex_context_t *ctx = (void *)*_ctx;
    EVP_PKEY *evppeer = NULL;
    EVP_PKEY_CTX *evpctx = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    secret->base = NULL;

    if (peerkey.len != ctx->super.pubkey.len) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }

    if ((evppeer = EVP_PKEY_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_copy_parameters(evppeer, ctx->privkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_set1_tls_encodedpoint(evppeer, peerkey.base, peerkey.len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((evpctx = EVP_PKEY_CTX_new(ctx->privkey, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_set_peer(evpctx, evppeer) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, NULL, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((secret->base = malloc(secret->len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, secret->base, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    ret = 0;
Exit:
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    if (evppeer != NULL)
        EVP_PKEY_free(evppeer);
    if (ret != 0)
        free(secret->base);
    if (release) {
        evp_keyex_free(ctx);
        *_ctx = NULL;
    }
    return ret;
}